

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinExporter.cpp
# Opt level: O0

size_t Assimp::WriteBounds<aiVectorKey>(IOStream *stream,aiVectorKey *in,uint size)

{
  size_t sVar1;
  size_t sVar2;
  size_t t;
  aiVectorKey maxc;
  aiVectorKey minc;
  uint size_local;
  aiVectorKey *in_local;
  IOStream *stream_local;
  
  aiVectorKey::aiVectorKey((aiVectorKey *)&maxc.mValue.z);
  aiVectorKey::aiVectorKey((aiVectorKey *)&t);
  ArrayBounds<aiVectorKey>(in,size,(aiVectorKey *)&maxc.mValue.z,(aiVectorKey *)&t);
  sVar1 = Write<aiVectorKey>(stream,(aiVectorKey *)&maxc.mValue.z);
  sVar2 = Write<aiVectorKey>(stream,(aiVectorKey *)&t);
  return sVar1 + sVar2;
}

Assistant:

inline
size_t WriteBounds(IOStream * stream, const T* in, unsigned int size) {
    T minc, maxc;
    ArrayBounds(in,size,minc,maxc);

    const size_t t = Write<T>(stream,minc);
    return t + Write<T>(stream,maxc);
}